

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
RehashGenericCommand::trigger(RehashGenericCommand *this,string_view parameters)

{
  long lVar1;
  ResponseLine *pRVar2;
  undefined8 uVar3;
  string local_80;
  undefined1 local_5d;
  string local_50;
  long local_30;
  size_t hash_errors;
  RehashGenericCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (RehashGenericCommand *)parameters._M_len;
  hash_errors = (size_t)this;
  local_30 = Jupiter::rehash();
  if (local_30 == 0) {
    pRVar2 = (ResponseLine *)operator_new(0x30);
    local_5d = 1;
    uVar3 = Jupiter::getRehashableCount();
    string_printf_abi_cxx11_(&local_50,"All %u objects were successfully rehashed.",uVar3);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_50,0);
    local_5d = 0;
    parameters_local._M_str = (char *)pRVar2;
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    pRVar2 = (ResponseLine *)operator_new(0x30);
    lVar1 = local_30;
    uVar3 = Jupiter::getRehashableCount();
    string_printf_abi_cxx11_
              (&local_80,"%u of %u objects failed to successfully rehash.",lVar1,uVar3);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_80,2);
    parameters_local._M_str = (char *)pRVar2;
    std::__cxx11::string::~string((string *)&local_80);
  }
  return (ResponseLine *)parameters_local._M_str;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *RehashGenericCommand::trigger(std::string_view parameters) {
	size_t hash_errors = Jupiter::rehash();

	if (hash_errors == 0)
		return new Jupiter::GenericCommand::ResponseLine(string_printf("All %u objects were successfully rehashed.", Jupiter::getRehashableCount()), GenericCommand::DisplayType::PublicSuccess);

	return new Jupiter::GenericCommand::ResponseLine(string_printf("%u of %u objects failed to successfully rehash.", hash_errors, Jupiter::getRehashableCount()), GenericCommand::DisplayType::PublicError);
}